

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O0

void Io_ReadPlaCubePreprocess(Vec_Str_t *vSop,int iCover,int fVerbose)

{
  uint nVars_00;
  int nWords_00;
  int iVar1;
  word **pCs_00;
  char *pcVar2;
  Vec_Bit_t *vMarks_00;
  Vec_Bit_t *vMarks;
  int Iter;
  int Count;
  int nCubesNew;
  int nWords;
  int nVars;
  int nCubes;
  word **pCs;
  int fVerbose_local;
  int iCover_local;
  Vec_Str_t *vSop_local;
  
  pCs_00 = Io_ReadPlaCubeSetup(vSop);
  pcVar2 = Vec_StrArray(vSop);
  nWords = Abc_SopGetCubeNum(pcVar2);
  pcVar2 = Vec_StrArray(vSop);
  nVars_00 = Abc_SopGetVarNum(pcVar2);
  nWords_00 = Abc_Bit6WordNum(nVars_00 << 1);
  vMarks_00 = Vec_BitStart(nWords);
  if (fVerbose != 0) {
    printf("Cover %5d : V =%5d  C%d =%5d",(ulong)(uint)iCover,(ulong)nVars_00,0,(ulong)(uint)nWords)
    ;
  }
  do {
    Io_ReadPlaMarkContained(pCs_00,nWords,nWords_00,vMarks_00);
    nWords = Io_ReadPlaRemoveMarked(pCs_00,nWords,nWords_00,vMarks_00);
    iVar1 = Io_ReadPlaMergeDistance1(pCs_00,nWords,nWords_00,vMarks_00);
  } while (iVar1 != 0);
  if (fVerbose != 0) {
    printf("  C%d =%5d",1,(ulong)(uint)nWords);
    printf("%4d",0);
  }
  Io_ReadPlaCubeSetdown(vSop,pCs_00,nWords,nVars_00);
  if (fVerbose != 0) {
    printf("\n");
  }
  Vec_BitFree(vMarks_00);
  if (*pCs_00 != (word *)0x0) {
    free(*pCs_00);
    *pCs_00 = (word *)0x0;
  }
  if (pCs_00 != (word **)0x0) {
    free(pCs_00);
  }
  return;
}

Assistant:

void Io_ReadPlaCubePreprocess( Vec_Str_t * vSop, int iCover, int fVerbose )
{
    word ** pCs = Io_ReadPlaCubeSetup( vSop );
    int nCubes  = Abc_SopGetCubeNum( Vec_StrArray(vSop) );
    int nVars   = Abc_SopGetVarNum( Vec_StrArray(vSop) );
    int nWords  = Abc_Bit6WordNum( 2*nVars );
    int nCubesNew, Count, Iter = 0;
    Vec_Bit_t * vMarks = Vec_BitStart( nCubes );
    if ( fVerbose )
        printf( "Cover %5d : V =%5d  C%d =%5d", iCover, nVars, Iter, nCubes );

    do 
    {
        Iter++;
        do 
        {
            // remove contained
            Io_ReadPlaMarkContained( pCs, nCubes, nWords, vMarks );
            nCubesNew = Io_ReadPlaRemoveMarked( pCs, nCubes, nWords, vMarks );
            //if ( fVerbose )
            //    printf( "  C =%5d", nCubes - nCubesNew );
            nCubes = nCubesNew;
            // merge distance-1
            Count = Io_ReadPlaMergeDistance1( pCs, nCubes, nWords, vMarks );
        } while ( Count );
        if ( fVerbose )
            printf( "  C%d =%5d", Iter, nCubes );
        // try consensus
        //Count = Io_ReadPlaSelfSubsumption( pCs, nCubes, nWords, vMarks );
        if ( fVerbose )
            printf( "%4d", Count );
    } while ( Count );

    // translate
    Io_ReadPlaCubeSetdown( vSop, pCs, nCubes, nVars );
    // finalize
    if ( fVerbose )
        printf( "\n" );
    Vec_BitFree( vMarks );
    ABC_FREE( pCs[0] );
    ABC_FREE( pCs );
}